

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcreteVisitor.hh
# Opt level: O2

shared_ptr<VisitorResult> __thiscall ConcreteVisitor::visit(ConcreteVisitor *this,ASTFrom *from)

{
  value_type *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ASTCollectionIdentifier *coll;
  value_type *__x;
  shared_ptr<VisitorResult> sVar3;
  shared_ptr<LogicalJoin> lj;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  colls;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  std::make_shared<LogicalJoin>();
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = *(value_type **)(in_RDX + 0x10);
  for (__x = *(value_type **)(in_RDX + 8); __x != pvVar1; __x = __x + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_38,__x);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(local_48,&local_38);
  _Var2._M_pi = _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)local_48;
  this[1].super_ASTVisitor._vptr_ASTVisitor = (_func_int **)_Var2._M_pi;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  sVar3.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<VisitorResult>)
         sVar3.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VisitorResult> visit(ASTFrom *from) override {
        auto lj = std::make_shared<LogicalJoin>();
        std::vector<std::string> colls;
        for (auto &coll: from->getCollections()) {
            colls.push_back(coll.getName());
        }
        lj->setCollections(colls);
        return lj;
    }